

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureFilterMinmaxUtils::Texture1D::Texture1D(Texture1D *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"float",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"sampler1D",&local_4a);
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0xde0,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_01dd2118;
  (this->m_texture).super_UniqueBase<glu::Texture1D,_de::DefaultDeleter<glu::Texture1D>_>.m_data.ptr
       = (Texture1D *)0x0;
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture1D::Texture1D() : SupportedTextureType(GL_TEXTURE_1D, "float", "sampler1D")
{
}